

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  cmMakefile *pcVar6;
  cmCTestAddTestCommand *this_00;
  cmState *pcVar7;
  cmCTestSubdirCommand *this_01;
  cmCTestAddSubdirectoryCommand *this_02;
  cmCTestSetTestsPropertiesCommand *this_03;
  cmCTestSetDirectoryPropertiesCommand *this_04;
  string local_d80 [32];
  undefined1 local_d60 [8];
  ostringstream cmCTestLog_msg_1;
  char *local_be0;
  char *testFilename;
  string local_bd0;
  cmCTestSetDirectoryPropertiesCommand *local_bb0;
  cmCTestSetDirectoryPropertiesCommand *newCom5;
  string local_ba0;
  cmCTestSetTestsPropertiesCommand *local_b80;
  cmCTestSetTestsPropertiesCommand *newCom4;
  string local_b70;
  cmCTestAddSubdirectoryCommand *local_b50;
  cmCTestAddSubdirectoryCommand *newCom3;
  string local_b40;
  cmCTestSubdirCommand *local_b20;
  cmCTestSubdirCommand *newCom2;
  string local_b10;
  cmCTestAddTestCommand *local_af0;
  cmCTestAddTestCommand *newCom1;
  string local_ae0;
  cmStateSnapshot local_ac0;
  auto_ptr<cmMakefile> local_aa8;
  auto_ptr<cmMakefile> mf;
  cmGlobalGenerator gg;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  undefined1 local_470 [8];
  cmake cm;
  ostringstream local_188 [8];
  ostringstream cmCTestLog_msg;
  cmCTestTestHandler *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::compile(&this->IncludeLabelRegularExpression,pcVar4);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::compile(&this->ExcludeLabelRegularExpression,pcVar4);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::compile(&this->IncludeTestsRegularExpression,pcVar4);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::compile(&this->ExcludeTestsRegularExpression,pcVar4);
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar5 = std::operator<<((ostream *)local_188,"Constructing a list of tests");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x6d7,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)&cm.Debugger);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  cmake::cmake((cmake *)local_470,RoleScript);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"",&local_491);
  cmake::SetHomeDirectory((cmake *)local_470,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"",&local_4b9);
  cmake::SetHomeOutputDirectory((cmake *)local_470,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_470);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&mf,(cmake *)local_470);
  pcVar6 = (cmMakefile *)operator_new(0x760);
  cmake::GetCurrentSnapshot(&local_ac0,(cmake *)local_470);
  cmMakefile::cmMakefile(pcVar6,(cmGlobalGenerator *)&mf,&local_ac0);
  ::cm::auto_ptr<cmMakefile>::auto_ptr(&local_aa8,pcVar6);
  pcVar6 = ::cm::auto_ptr<cmMakefile>::operator->(&local_aa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ae0,"CTEST_CONFIGURATION_TYPE",(allocator *)((long)&newCom1 + 7));
  cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar6,&local_ae0,pcVar4);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&newCom1 + 7));
  this_00 = (cmCTestAddTestCommand *)operator_new(0x38);
  cmCTestAddTestCommand::cmCTestAddTestCommand(this_00);
  this_00->TestHandler = this;
  local_af0 = this_00;
  pcVar7 = cmake::GetState((cmake *)local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b10,"add_test",(allocator *)((long)&newCom2 + 7));
  cmState::AddBuiltinCommand(pcVar7,&local_b10,&local_af0->super_cmCommand);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&newCom2 + 7));
  this_01 = (cmCTestSubdirCommand *)operator_new(0x38);
  cmCTestSubdirCommand::cmCTestSubdirCommand(this_01);
  this_01->TestHandler = this;
  local_b20 = this_01;
  pcVar7 = cmake::GetState((cmake *)local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b40,"subdirs",(allocator *)((long)&newCom3 + 7));
  cmState::AddBuiltinCommand(pcVar7,&local_b40,&local_b20->super_cmCommand);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator((allocator<char> *)((long)&newCom3 + 7));
  this_02 = (cmCTestAddSubdirectoryCommand *)operator_new(0x38);
  cmCTestAddSubdirectoryCommand::cmCTestAddSubdirectoryCommand(this_02);
  this_02->TestHandler = this;
  local_b50 = this_02;
  pcVar7 = cmake::GetState((cmake *)local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b70,"add_subdirectory",(allocator *)((long)&newCom4 + 7));
  cmState::AddBuiltinCommand(pcVar7,&local_b70,&local_b50->super_cmCommand);
  std::__cxx11::string::~string((string *)&local_b70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&newCom4 + 7));
  this_03 = (cmCTestSetTestsPropertiesCommand *)operator_new(0x38);
  cmCTestSetTestsPropertiesCommand::cmCTestSetTestsPropertiesCommand(this_03);
  this_03->TestHandler = this;
  local_b80 = this_03;
  pcVar7 = cmake::GetState((cmake *)local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ba0,"set_tests_properties",(allocator *)((long)&newCom5 + 7));
  cmState::AddBuiltinCommand(pcVar7,&local_ba0,&local_b80->super_cmCommand);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&newCom5 + 7));
  this_04 = (cmCTestSetDirectoryPropertiesCommand *)operator_new(0x38);
  cmCTestSetDirectoryPropertiesCommand::cmCTestSetDirectoryPropertiesCommand(this_04);
  this_04->TestHandler = this;
  local_bb0 = this_04;
  pcVar7 = cmake::GetState((cmake *)local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bd0,"set_directory_properties",(allocator *)((long)&testFilename + 7))
  ;
  cmState::AddBuiltinCommand(pcVar7,&local_bd0,&local_bb0->super_cmCommand);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testFilename + 7));
  bVar2 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (bVar2) {
    local_be0 = "CTestTestfile.cmake";
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    if (!bVar2) goto LAB_005cfe04;
    local_be0 = "DartTestfile.txt";
  }
  pcVar6 = ::cm::auto_ptr<cmMakefile>::operator->(&local_aa8);
  bVar2 = cmMakefile::ReadListFile(pcVar6,local_be0);
  if ((bVar2) && (bVar2 = cmSystemTools::GetErrorOccuredFlag(), !bVar2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d60);
    poVar5 = std::operator<<((ostream *)local_d60,"Done constructing a list of tests");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x70f,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_d80);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d60);
  }
LAB_005cfe04:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_aa8);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf);
  cmake::~cmake((cmake *)local_470);
  return;
}

Assistant:

void cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeLabelRegExp.empty()) {
    this->IncludeLabelRegularExpression.compile(
      this->IncludeLabelRegExp.c_str());
  }
  if (!this->ExcludeLabelRegExp.empty()) {
    this->ExcludeLabelRegularExpression.compile(
      this->ExcludeLabelRegExp.c_str());
  }
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp.c_str());
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp.c_str());
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  mf->AddDefinition("CTEST_CONFIGURATION_TYPE",
                    this->CTest->GetConfigType().c_str());

  // Add handler for ADD_TEST
  cmCTestAddTestCommand* newCom1 = new cmCTestAddTestCommand;
  newCom1->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("add_test", newCom1);

  // Add handler for SUBDIRS
  cmCTestSubdirCommand* newCom2 = new cmCTestSubdirCommand;
  newCom2->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("subdirs", newCom2);

  // Add handler for ADD_SUBDIRECTORY
  cmCTestAddSubdirectoryCommand* newCom3 = new cmCTestAddSubdirectoryCommand;
  newCom3->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("add_subdirectory", newCom3);

  // Add handler for SET_TESTS_PROPERTIES
  cmCTestSetTestsPropertiesCommand* newCom4 =
    new cmCTestSetTestsPropertiesCommand;
  newCom4->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("set_tests_properties", newCom4);

  // Add handler for SET_DIRECTORY_PROPERTIES
  cmCTestSetDirectoryPropertiesCommand* newCom5 =
    new cmCTestSetDirectoryPropertiesCommand;
  newCom5->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("set_directory_properties", newCom5);

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return;
  }

  if (!mf->ReadListFile(testFilename)) {
    return;
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
}